

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O0

int cali_variant_compare(cali_variant_t lhs,cali_variant_t rhs)

{
  int iVar1;
  int l;
  int iVar2;
  ulong uVar3;
  anon_union_8_7_33918203_for_value __s2;
  anon_union_8_7_33918203_for_value __s1;
  uint local_ac;
  undefined4 local_a8;
  int local_a4;
  int local_8c;
  int local_70;
  int local_6c;
  double diff_1;
  uint64_t diff;
  int cmp_1;
  int rhssize_1;
  int lhssize_1;
  int cmp;
  int rhssize;
  int lhssize;
  cali_attr_type rhstype;
  cali_attr_type lhstype;
  uint64_t t;
  cali_variant_t rhs_local;
  cali_variant_t lhs_local;
  int r;
  
  __s2 = rhs.value;
  __s1 = lhs.value;
  uVar3 = lhs.type_and_size & 0xff;
  if (uVar3 < 10) {
    local_6c = (int)uVar3;
  }
  else {
    local_6c = 0;
  }
  uVar3 = rhs.type_and_size & 0xff;
  if (uVar3 < 10) {
    local_70 = (int)uVar3;
  }
  else {
    local_70 = 0;
  }
  if (local_6c == local_70) {
    iVar2 = lhs.value._0_4_;
    iVar1 = rhs.value._0_4_;
    l = lhs.type_and_size._4_4_;
    r = rhs.type_and_size._4_4_;
    switch(local_6c) {
    case 0:
      lhs_local.value.v_uint._4_4_ = iVar2 - iVar1;
      break;
    case 1:
      iVar2 = imin(l,r);
      local_8c = memcmp(__s1.unmanaged_ptr,__s2.unmanaged_ptr,(long)iVar2);
      if (local_8c == 0) {
        local_8c = l - r;
      }
      lhs_local.value.v_uint._4_4_ = local_8c;
      break;
    case 2:
      lhs_local.value.v_uint._4_4_ = iVar2 - iVar1;
      break;
    case 3:
    case 5:
      if (__s1.v_uint == __s2.v_uint) {
        local_a8 = 0;
      }
      else {
        local_a8 = 1;
        if (__s1.v_uint < (char *)((long)__s1.unmanaged_ptr - (long)__s2)) {
          local_a8 = 0xffffffff;
        }
      }
      lhs_local.value.v_uint._4_4_ = local_a8;
      break;
    case 4:
      iVar2 = imin(l,r);
      local_a4 = strncmp((char *)__s1.unmanaged_ptr,(char *)__s2.unmanaged_ptr,(long)iVar2);
      if (local_a4 == 0) {
        local_a4 = l - r;
      }
      lhs_local.value.v_uint._4_4_ = local_a4;
      break;
    case 6:
      if (0.0 <= __s1.v_double - __s2.v_double) {
        local_ac = (uint)(0.0 < __s1.v_double - __s2.v_double);
      }
      else {
        local_ac = 0xffffffff;
      }
      lhs_local.value.v_uint._4_4_ = local_ac;
      break;
    case 7:
      lhs_local.value.v_uint._4_4_ =
           (uint)(((undefined1  [16])lhs & (undefined1  [16])0x1) != (undefined1  [16])0x0) -
           (uint)(((undefined1  [16])rhs & (undefined1  [16])0x1) != (undefined1  [16])0x0);
      break;
    case 8:
      lhs_local.value.v_uint._4_4_ = iVar2 - iVar1;
      break;
    case 9:
      lhs_local.value.v_uint._4_4_ = iVar2 - iVar1;
      break;
    default:
      goto switchD_00326570_default;
    }
  }
  else {
switchD_00326570_default:
    lhs_local.value.v_uint._4_4_ = local_6c - local_70;
  }
  return lhs_local.value.v_int._4_4_;
}

Assistant:

int cali_variant_compare(cali_variant_t lhs, cali_variant_t rhs)
{
    uint64_t       t       = _EXTRACT_TYPE(lhs.type_and_size);
    cali_attr_type lhstype = (t <= CALI_MAXTYPE ? (cali_attr_type) t : CALI_TYPE_INV);
    t                      = _EXTRACT_TYPE(rhs.type_and_size);
    cali_attr_type rhstype = (t <= CALI_MAXTYPE ? (cali_attr_type) t : CALI_TYPE_INV);

    if (lhstype == rhstype) {
        switch (lhstype) {
        case CALI_TYPE_INV:
            return lhs.value.v_int - rhs.value.v_int;
        case CALI_TYPE_USR:
            {
                int lhssize = (int) _EXTRACT_SIZE(lhs.type_and_size);
                int rhssize = (int) _EXTRACT_SIZE(rhs.type_and_size);
                int cmp = memcmp(lhs.value.unmanaged_const_ptr, rhs.value.unmanaged_const_ptr, imin(lhssize, rhssize));

                return (cmp ? cmp : (lhssize - rhssize));
            }
        case CALI_TYPE_STRING:
            {
                int lhssize = (int) _EXTRACT_SIZE(lhs.type_and_size);
                int rhssize = (int) _EXTRACT_SIZE(rhs.type_and_size);
                int cmp = strncmp(lhs.value.unmanaged_const_ptr, rhs.value.unmanaged_const_ptr, imin(lhssize, rhssize));

                return (cmp ? cmp : (lhssize - rhssize));
            }
        case CALI_TYPE_INT:
            return lhs.value.v_int - rhs.value.v_int;
        case CALI_TYPE_ADDR:
        case CALI_TYPE_UINT:
            {
                uint64_t diff = lhs.value.v_uint - rhs.value.v_uint;
                return (diff == 0 ? 0 : (diff > lhs.value.v_uint ? -1 : 1));
            }
        case CALI_TYPE_DOUBLE:
            {
                double diff = lhs.value.v_double - rhs.value.v_double;
                return (diff < 0.0 ? -1 : (diff > 0.0 ? 1 : 0));
            }
        case CALI_TYPE_BOOL:
            {
                return (lhs.value.v_bool ? 1 : 0) - (rhs.value.v_bool ? 1 : 0);
            }
        case CALI_TYPE_TYPE:
            return ((int) lhs.value.v_type) - ((int) rhs.value.v_type);
        case CALI_TYPE_PTR:
            return (int) ((char const*) (lhs.value.unmanaged_ptr) - (char const*) (rhs.value.unmanaged_ptr));
        }
    }

    return ((int) lhstype) - ((int) rhstype);
}